

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMI_DH_PARENT_Unmarshal(TPMI_DH_PARENT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  int iVar1;
  UINT32 UVar2;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  if (iVar1 < 4) {
    return 0x9a;
  }
  UVar2 = ByteArrayToUint32(*buffer);
  *target = UVar2;
  *buffer = *buffer + 4;
  if ((1 < UVar2 + 0xbffffff5) && (UVar2 != 0x40000001)) {
    if (UVar2 == 0x40000007) {
      if (flag == 0) {
        return 0x84;
      }
    }
    else if (-0x7ffffffe < (int)UVar2 && UVar2 + 0x7e000000 < 0xff000000) {
      return 0x84;
    }
  }
  return 0;
}

Assistant:

TPM_RC
TPMI_DH_PARENT_Unmarshal(TPMI_DH_PARENT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
        case TPM_RH_PLATFORM:
        case TPM_RH_ENDORSEMENT:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            if(((*target < TRANSIENT_FIRST) || (*target > TRANSIENT_LAST))
              &&((*target < PERSISTENT_FIRST) || (*target > PERSISTENT_LAST)))
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}